

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O1

void rw::clearMatFX(MatFX *matfx)

{
  int iVar1;
  Texture *pTVar2;
  long lVar3;
  
  lVar3 = 0x18;
  do {
    iVar1 = *(int *)((long)matfx->fx + lVar3 + -0x18);
    if (iVar1 == 4) {
      pTVar2 = *(Texture **)((long)matfx->fx + lVar3 + -0x10);
LAB_0012f256:
      if (pTVar2 != (Texture *)0x0) {
        Texture::destroy(pTVar2);
      }
    }
    else {
      if (iVar1 == 2) {
        pTVar2 = *(Texture **)((long)matfx->fx + lVar3 + -8);
        goto LAB_0012f256;
      }
      if (iVar1 == 1) {
        pTVar2 = *(Texture **)((long)matfx->fx + lVar3 + -8);
        if (pTVar2 != (Texture *)0x0) {
          Texture::destroy(pTVar2);
        }
        pTVar2 = *(Texture **)((long)&matfx->fx[0].type + lVar3);
        goto LAB_0012f256;
      }
    }
    lVar3 = lVar3 + 0x28;
    if (lVar3 != 0x40) {
      matfx->fx[1].field_1.bump.tex = (Texture *)0x0;
      *(undefined8 *)((long)&matfx->fx[1].field_1 + 0x18) = 0;
      matfx->fx[1].field_1.bump.frame = (Frame *)0x0;
      matfx->fx[1].field_1.bump.bumpedTex = (Texture *)0x0;
      *(undefined8 *)((long)&matfx->fx[0].field_1 + 0x18) = 0;
      *(undefined8 *)(matfx->fx + 1) = 0;
      matfx->fx[0].field_1.bump.bumpedTex = (Texture *)0x0;
      matfx->fx[0].field_1.bump.tex = (Texture *)0x0;
      *(undefined8 *)matfx->fx = 0;
      matfx->fx[0].field_1.bump.frame = (Frame *)0x0;
      *(undefined8 *)&matfx->type = 0;
      return;
    }
  } while( true );
}

Assistant:

static void
clearMatFX(MatFX *matfx)
{
	for(int i = 0; i < 2; i++)
		switch(matfx->fx[i].type){
		case MatFX::BUMPMAP:
			if(matfx->fx[i].bump.bumpedTex)
				matfx->fx[i].bump.bumpedTex->destroy();
			if(matfx->fx[i].bump.tex)
				matfx->fx[i].bump.tex->destroy();
			break;

		case MatFX::ENVMAP:
			if(matfx->fx[i].env.tex)
				matfx->fx[i].env.tex->destroy();
			break;

		case MatFX::DUAL:
			if(matfx->fx[i].dual.tex)
				matfx->fx[i].dual.tex->destroy();
			break;
		}
	memset(matfx, 0, sizeof(MatFX));
}